

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void SplitByteVectorCommand
               (MemoryManager *m,uint16_t *data,size_t length,size_t symbols_per_histogram,
               size_t max_histograms,size_t sampling_stride_length,double block_switch_cost,
               BrotliEncoderParams *params,BlockSplit *split)

{
  int iVar1;
  ulong uVar2;
  HistogramCommand *histograms_00;
  HistogramCommand *histograms_01;
  double *insert_cost_00;
  double *data_00;
  void *pvVar3;
  uint16_t *new_id_00;
  ulong in_RCX;
  ulong in_RDX;
  uint8_t *in_R8;
  uint8_t *in_R9;
  long in_stack_00000008;
  undefined8 *in_stack_00000010;
  size_t i;
  size_t iters;
  uint16_t *new_id;
  uint8_t *switch_signal;
  double *cost;
  double *insert_cost;
  size_t bitmaplen;
  size_t num_blocks;
  uint8_t *block_ids;
  uint32_t *new_array_1;
  size_t _new_size_1;
  uint8_t *new_array;
  size_t _new_size;
  size_t num_histograms;
  HistogramCommand *tmp;
  HistogramCommand *histograms;
  size_t data_size;
  size_t in_stack_00000140;
  size_t in_stack_00000148;
  uint16_t *in_stack_00000150;
  MemoryManager *in_stack_00000158;
  void *in_stack_fffffffffffffed8;
  HistogramCommand *in_stack_fffffffffffffee0;
  HistogramCommand *in_stack_fffffffffffffee8;
  HistogramCommand *in_stack_fffffffffffffef0;
  uint16_t *block_ids_00;
  size_t in_stack_fffffffffffffef8;
  void *pvVar4;
  size_t in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  uint16_t *in_stack_ffffffffffffff10;
  void *local_e0;
  void *local_d0;
  ulong local_c8;
  ulong local_c0;
  double *pdVar5;
  size_t num_histograms_00;
  HistogramCommand *block_ids_01;
  size_t in_stack_ffffffffffffff88;
  uint16_t *in_stack_ffffffffffffff90;
  ulong local_60;
  uint8_t *local_58;
  
  local_58 = (uint8_t *)(in_RDX / in_RCX + 1);
  if (in_R8 < local_58) {
    local_58 = in_R8;
  }
  if (in_RDX == 0) {
    *in_stack_00000010 = 1;
  }
  else if (in_RDX < 0x80) {
    if ((ulong)in_stack_00000010[4] < in_stack_00000010[1] + 1) {
      if (in_stack_00000010[4] == 0) {
        local_c8 = in_stack_00000010[1] + 1;
      }
      else {
        local_c8 = in_stack_00000010[4];
      }
      for (local_60 = local_c8; local_60 < in_stack_00000010[1] + 1; local_60 = local_60 << 1) {
      }
      if (local_60 == 0) {
        local_d0 = (void *)0x0;
      }
      else {
        local_d0 = duckdb_brotli::BrotliAllocate
                             ((MemoryManager *)in_stack_fffffffffffffee0,
                              (size_t)in_stack_fffffffffffffed8);
      }
      if (in_stack_00000010[4] != 0) {
        memcpy(local_d0,(void *)in_stack_00000010[2],in_stack_00000010[4]);
      }
      duckdb_brotli::BrotliFree
                ((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      in_stack_00000010[2] = 0;
      in_stack_00000010[2] = local_d0;
      in_stack_00000010[4] = local_60;
    }
    if ((ulong)in_stack_00000010[5] < in_stack_00000010[1] + 1) {
      if (in_stack_00000010[5] == 0) {
        uVar2 = in_stack_00000010[1] + 1;
      }
      else {
        uVar2 = in_stack_00000010[5];
      }
      for (; uVar2 < in_stack_00000010[1] + 1; uVar2 = uVar2 << 1) {
      }
      if (uVar2 == 0) {
        local_e0 = (void *)0x0;
      }
      else {
        local_e0 = duckdb_brotli::BrotliAllocate
                             ((MemoryManager *)in_stack_fffffffffffffee0,
                              (size_t)in_stack_fffffffffffffed8);
      }
      if (in_stack_00000010[5] != 0) {
        memcpy(local_e0,(void *)in_stack_00000010[3],in_stack_00000010[5] << 2);
      }
      duckdb_brotli::BrotliFree
                ((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      in_stack_00000010[3] = 0;
      in_stack_00000010[3] = local_e0;
      in_stack_00000010[5] = uVar2;
    }
    *in_stack_00000010 = 1;
    *(undefined1 *)(in_stack_00000010[2] + in_stack_00000010[1]) = 0;
    *(int *)(in_stack_00000010[3] + in_stack_00000010[1] * 4) = (int)in_RDX;
    in_stack_00000010[1] = in_stack_00000010[1] + 1;
  }
  else {
    if (local_58 != (uint8_t *)0xffffffffffffffff) {
      duckdb_brotli::BrotliAllocate
                ((MemoryManager *)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    }
    InitialEntropyCodesCommand
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    RefineEntropyCodesCommand
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (in_RDX == 0) {
      histograms_00 = (HistogramCommand *)0x0;
    }
    else {
      histograms_00 =
           (HistogramCommand *)
           duckdb_brotli::BrotliAllocate
                     ((MemoryManager *)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    }
    num_histograms_00 = 0;
    histograms_01 = (HistogramCommand *)((ulong)(local_58 + 7) >> 3);
    if ((long)local_58 * 0x2c0 == 0) {
      insert_cost_00 = (double *)0x0;
    }
    else {
      insert_cost_00 =
           (double *)
           duckdb_brotli::BrotliAllocate
                     ((MemoryManager *)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
    }
    if (local_58 == (uint8_t *)0x0) {
      data_00 = (double *)0x0;
    }
    else {
      data_00 = (double *)
                duckdb_brotli::BrotliAllocate
                          ((MemoryManager *)in_stack_fffffffffffffee0,
                           (size_t)in_stack_fffffffffffffed8);
    }
    pdVar5 = data_00;
    if (in_RDX * (long)histograms_01 == 0) {
      pvVar3 = (void *)0x0;
    }
    else {
      pvVar3 = duckdb_brotli::BrotliAllocate
                         ((MemoryManager *)in_stack_fffffffffffffee0,
                          (size_t)in_stack_fffffffffffffed8);
    }
    pvVar4 = pvVar3;
    if (local_58 == (uint8_t *)0x0) {
      new_id_00 = (uint16_t *)0x0;
    }
    else {
      new_id_00 = (uint16_t *)
                  duckdb_brotli::BrotliAllocate
                            ((MemoryManager *)in_stack_fffffffffffffee0,
                             (size_t)in_stack_fffffffffffffed8);
    }
    iVar1 = 10;
    if (*(int *)(in_stack_00000008 + 4) < 0xb) {
      iVar1 = 3;
    }
    block_ids_00 = new_id_00;
    for (local_c0 = 0; local_c0 < (ulong)(long)iVar1; local_c0 = local_c0 + 1) {
      in_stack_fffffffffffffed8 = pvVar3;
      block_ids_01 = histograms_00;
      num_histograms_00 =
           FindBlocksCommand(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                             (double)histograms_00,num_histograms_00,histograms_01,insert_cost_00,
                             pdVar5,in_R9,in_R8);
      local_58 = (uint8_t *)
                 RemapBlockIdsCommand((uint8_t *)block_ids_01,in_RDX,new_id_00,(size_t)local_58);
      BuildBlockHistogramsCommand
                ((uint16_t *)data_00,(size_t)pvVar4,(uint8_t *)block_ids_00,
                 (size_t)in_stack_fffffffffffffee8,histograms_00);
      in_stack_fffffffffffffee0 = histograms_00;
      histograms_00 = block_ids_01;
    }
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    ClusterBlocksCommand
              (in_stack_00000158,in_stack_00000150,in_stack_00000148,in_stack_00000140,
               (uint8_t *)split,(BlockSplit *)params);
    duckdb_brotli::BrotliFree((MemoryManager *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

static void FN(SplitByteVector)(MemoryManager* m,
                                const DataType* data, const size_t length,
                                const size_t symbols_per_histogram,
                                const size_t max_histograms,
                                const size_t sampling_stride_length,
                                const double block_switch_cost,
                                const BrotliEncoderParams* params,
                                BlockSplit* split) {
  const size_t data_size = FN(HistogramDataSize)();
  HistogramType* histograms;
  HistogramType* tmp;
  /* Calculate number of histograms; initial estimate is one histogram per
   * specified amount of symbols; however, this value is capped. */
  size_t num_histograms = length / symbols_per_histogram + 1;
  if (num_histograms > max_histograms) {
    num_histograms = max_histograms;
  }

  /* Corner case: no input. */
  if (length == 0) {
    split->num_types = 1;
    return;
  }

  if (length < kMinLengthForBlockSplitting) {
    BROTLI_ENSURE_CAPACITY(m, uint8_t,
        split->types, split->types_alloc_size, split->num_blocks + 1);
    BROTLI_ENSURE_CAPACITY(m, uint32_t,
        split->lengths, split->lengths_alloc_size, split->num_blocks + 1);
    if (BROTLI_IS_OOM(m)) return;
    split->num_types = 1;
    split->types[split->num_blocks] = 0;
    split->lengths[split->num_blocks] = (uint32_t)length;
    split->num_blocks++;
    return;
  }
  histograms = BROTLI_ALLOC(m, HistogramType, num_histograms + 1);
  tmp = histograms + num_histograms;
  if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(histograms)) return;
  /* Find good entropy codes. */
  FN(InitialEntropyCodes)(data, length,
                          sampling_stride_length,
                          num_histograms, histograms);
  FN(RefineEntropyCodes)(data, length,
                         sampling_stride_length,
                         num_histograms, histograms, tmp);
  {
    /* Find a good path through literals with the good entropy codes. */
    uint8_t* block_ids = BROTLI_ALLOC(m, uint8_t, length);
    size_t num_blocks = 0;
    const size_t bitmaplen = (num_histograms + 7) >> 3;
    double* insert_cost = BROTLI_ALLOC(m, double, data_size * num_histograms);
    double* cost = BROTLI_ALLOC(m, double, num_histograms);
    uint8_t* switch_signal = BROTLI_ALLOC(m, uint8_t, length * bitmaplen);
    uint16_t* new_id = BROTLI_ALLOC(m, uint16_t, num_histograms);
    const size_t iters = params->quality < HQ_ZOPFLIFICATION_QUALITY ? 3 : 10;
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(block_ids) ||
        BROTLI_IS_NULL(insert_cost) || BROTLI_IS_NULL(cost) ||
        BROTLI_IS_NULL(switch_signal) || BROTLI_IS_NULL(new_id)) {
      return;
    }
    for (i = 0; i < iters; ++i) {
      num_blocks = FN(FindBlocks)(data, length,
                                  block_switch_cost,
                                  num_histograms, histograms,
                                  insert_cost, cost, switch_signal,
                                  block_ids);
      num_histograms = FN(RemapBlockIds)(block_ids, length,
                                         new_id, num_histograms);
      FN(BuildBlockHistograms)(data, length, block_ids,
                               num_histograms, histograms);
    }
    BROTLI_FREE(m, insert_cost);
    BROTLI_FREE(m, cost);
    BROTLI_FREE(m, switch_signal);
    BROTLI_FREE(m, new_id);
    BROTLI_FREE(m, histograms);
    FN(ClusterBlocks)(m, data, length, num_blocks, block_ids, split);
    if (BROTLI_IS_OOM(m)) return;
    BROTLI_FREE(m, block_ids);
  }
}